

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11fwd.c
# Opt level: O0

X11FakeAuth * x11_invent_fake_auth(tree234 *authtree,int authtype)

{
  X11FakeAuth *e;
  uchar *puVar1;
  X11FakeAuth *pXVar2;
  tree234 *ptVar3;
  char *pcVar4;
  int local_24;
  int i;
  X11FakeAuth *auth;
  int authtype_local;
  tree234 *authtree_local;
  
  e = (X11FakeAuth *)safemalloc(1,0x50,0);
  if (authtype == 1) {
    e->proto = 1;
    e->datalen = 0x10;
    puVar1 = (uchar *)safemalloc((long)e->datalen,1,0);
    e->data = puVar1;
    e->xa1_firstblock = (uchar *)0x0;
    do {
      random_read(e->data,(long)e->datalen);
      pXVar2 = (X11FakeAuth *)add234(authtree,e);
    } while (pXVar2 != e);
    e->xdmseen = (tree234 *)0x0;
  }
  else {
    if (authtype != 2) {
      __assert_fail("authtype == X11_XDM",
                    "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/x11fwd.c"
                    ,0x5d,"struct X11FakeAuth *x11_invent_fake_auth(tree234 *, int)");
    }
    e->proto = 2;
    e->datalen = 0x10;
    puVar1 = (uchar *)safemalloc((long)e->datalen,1,0);
    e->data = puVar1;
    puVar1 = (uchar *)safemalloc(8,1,0);
    e->xa1_firstblock = puVar1;
    memset(e->xa1_firstblock,0,8);
    do {
      random_read(e->data,0xf);
      e->data[0xf] = e->data[8];
      e->data[8] = '\0';
      *(undefined8 *)e->xa1_firstblock = *(undefined8 *)e->data;
      des_encrypt_xdmauth(e->data + 9,e->xa1_firstblock,8);
      pXVar2 = (X11FakeAuth *)add234(authtree,e);
    } while (pXVar2 != e);
    ptVar3 = newtree234(xdmseen_cmp);
    e->xdmseen = ptVar3;
  }
  pcVar4 = dupstr(x11_authnames[e->proto]);
  e->protoname = pcVar4;
  pcVar4 = (char *)safemalloc((long)(e->datalen * 2 + 1),1,0);
  e->datastring = pcVar4;
  for (local_24 = 0; local_24 < e->datalen; local_24 = local_24 + 1) {
    sprintf(e->datastring + (local_24 << 1),"%02x",(ulong)e->data[local_24]);
  }
  e->disp = (X11Display *)0x0;
  e->share_cs = (ssh_sharing_connstate *)0x0;
  e->share_chan = (share_channel *)0x0;
  return e;
}

Assistant:

struct X11FakeAuth *x11_invent_fake_auth(tree234 *authtree, int authtype)
{
    struct X11FakeAuth *auth = snew(struct X11FakeAuth);
    int i;

    /*
     * This function has the job of inventing a set of X11 fake auth
     * data, and adding it to 'authtree'. We must preserve the
     * property that for any given actual authorisation attempt, _at
     * most one_ thing in the tree can possibly match it.
     *
     * For MIT-MAGIC-COOKIE-1, that's not too difficult: the match
     * criterion is simply that the entire cookie is correct, so we
     * just have to make sure we don't make up two cookies the same.
     * (Vanishingly unlikely, but we check anyway to be sure, and go
     * round again inventing a new cookie if add234 tells us the one
     * we thought of is already in use.)
     *
     * For XDM-AUTHORIZATION-1, it's a little more fiddly. The setup
     * with XA1 is that half the cookie is used as a DES key with
     * which to CBC-encrypt an assortment of stuff. Happily, the stuff
     * encrypted _begins_ with the other half of the cookie, and the
     * IV is always zero, which means that any valid XA1 authorisation
     * attempt for a given cookie must begin with the same cipher
     * block, consisting of the DES ECB encryption of the first half
     * of the cookie using the second half as a key. So we compute
     * that cipher block here and now, and use it as the sorting key
     * for distinguishing XA1 entries in the tree.
     */

    if (authtype == X11_MIT) {
        auth->proto = X11_MIT;

        /* MIT-MAGIC-COOKIE-1. Cookie size is 128 bits (16 bytes). */
        auth->datalen = 16;
        auth->data = snewn(auth->datalen, unsigned char);
        auth->xa1_firstblock = NULL;

        while (1) {
            random_read(auth->data, auth->datalen);
            if (add234(authtree, auth) == auth)
                break;
        }

        auth->xdmseen = NULL;
    } else {
        assert(authtype == X11_XDM);
        auth->proto = X11_XDM;

        /* XDM-AUTHORIZATION-1. Cookie size is 16 bytes; byte 8 is zero. */
        auth->datalen = 16;
        auth->data = snewn(auth->datalen, unsigned char);
        auth->xa1_firstblock = snewn(8, unsigned char);
        memset(auth->xa1_firstblock, 0, 8);

        while (1) {
            random_read(auth->data, 15);
            auth->data[15] = auth->data[8];
            auth->data[8] = 0;

            memcpy(auth->xa1_firstblock, auth->data, 8);
            des_encrypt_xdmauth(auth->data + 9, auth->xa1_firstblock, 8);
            if (add234(authtree, auth) == auth)
                break;
        }

        auth->xdmseen = newtree234(xdmseen_cmp);
    }
    auth->protoname = dupstr(x11_authnames[auth->proto]);
    auth->datastring = snewn(auth->datalen * 2 + 1, char);
    for (i = 0; i < auth->datalen; i++)
        sprintf(auth->datastring + i*2, "%02x",
                auth->data[i]);

    auth->disp = NULL;
    auth->share_cs = NULL;
    auth->share_chan = NULL;

    return auth;
}